

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O0

_Bool match_ssl_primary_config(Curl_easy *data,ssl_primary_config *c1,ssl_primary_config *c2)

{
  _Bool _Var1;
  int iVar2;
  ssl_primary_config *c2_local;
  ssl_primary_config *c1_local;
  Curl_easy *data_local;
  
  if (((((((c1->version == c2->version) && (c1->version_max == c2->version_max)) &&
         (c1->ssl_options == c2->ssl_options)) &&
        (((c1->field_0x79 & 1) == (c2->field_0x79 & 1) &&
         (((byte)c1->field_0x79 >> 1 & 1) == ((byte)c2->field_0x79 >> 1 & 1))))) &&
       (((((byte)c1->field_0x79 >> 2 & 1) == ((byte)c2->field_0x79 >> 2 & 1) &&
         ((_Var1 = blobcmp(c1->cert_blob,c2->cert_blob), _Var1 &&
          (_Var1 = blobcmp(c1->ca_info_blob,c2->ca_info_blob), _Var1)))) &&
        (_Var1 = blobcmp(c1->issuercert_blob,c2->issuercert_blob), _Var1)))) &&
      ((((_Var1 = Curl_safecmp(c1->CApath,c2->CApath), _Var1 &&
         (_Var1 = Curl_safecmp(c1->CAfile,c2->CAfile), _Var1)) &&
        (_Var1 = Curl_safecmp(c1->issuercert,c2->issuercert), _Var1)) &&
       (((_Var1 = Curl_safecmp(c1->clientcert,c2->clientcert), _Var1 &&
         (iVar2 = Curl_timestrcmp(c1->username,c2->username), iVar2 == 0)) &&
        ((iVar2 = Curl_timestrcmp(c1->password,c2->password), iVar2 == 0 &&
         ((iVar2 = curl_strequal(c1->cipher_list,c2->cipher_list), iVar2 != 0 &&
          (iVar2 = curl_strequal(c1->cipher_list13,c2->cipher_list13), iVar2 != 0)))))))))) &&
     ((iVar2 = curl_strequal(c1->curves,c2->curves), iVar2 != 0 &&
      ((iVar2 = curl_strequal(c1->CRLfile,c2->CRLfile), iVar2 != 0 &&
       (iVar2 = curl_strequal(c1->pinned_key,c2->pinned_key), iVar2 != 0)))))) {
    data_local._7_1_ = true;
  }
  else {
    data_local._7_1_ = false;
  }
  return data_local._7_1_;
}

Assistant:

static bool
match_ssl_primary_config(struct Curl_easy *data,
                         struct ssl_primary_config *c1,
                         struct ssl_primary_config *c2)
{
  (void)data;
  if((c1->version == c2->version) &&
     (c1->version_max == c2->version_max) &&
     (c1->ssl_options == c2->ssl_options) &&
     (c1->verifypeer == c2->verifypeer) &&
     (c1->verifyhost == c2->verifyhost) &&
     (c1->verifystatus == c2->verifystatus) &&
     blobcmp(c1->cert_blob, c2->cert_blob) &&
     blobcmp(c1->ca_info_blob, c2->ca_info_blob) &&
     blobcmp(c1->issuercert_blob, c2->issuercert_blob) &&
     Curl_safecmp(c1->CApath, c2->CApath) &&
     Curl_safecmp(c1->CAfile, c2->CAfile) &&
     Curl_safecmp(c1->issuercert, c2->issuercert) &&
     Curl_safecmp(c1->clientcert, c2->clientcert) &&
#ifdef USE_TLS_SRP
     !Curl_timestrcmp(c1->username, c2->username) &&
     !Curl_timestrcmp(c1->password, c2->password) &&
#endif
     strcasecompare(c1->cipher_list, c2->cipher_list) &&
     strcasecompare(c1->cipher_list13, c2->cipher_list13) &&
     strcasecompare(c1->curves, c2->curves) &&
     strcasecompare(c1->CRLfile, c2->CRLfile) &&
     strcasecompare(c1->pinned_key, c2->pinned_key))
    return TRUE;

  return FALSE;
}